

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int generate_by_descriptor_multisig
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,int flag,
              uchar *script,size_t script_len,size_t *write_len)

{
  uchar *puVar1;
  int *piVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  void *__base;
  miniscript_node_t *pmVar6;
  miniscript_node_t *pmVar7;
  ulong uVar8;
  size_t sVar9;
  size_t offset;
  size_t local_70;
  ulong local_68;
  size_t local_60;
  uchar *local_58;
  size_t local_50;
  int local_44;
  size_t local_40;
  miniscript_node_t *local_38;
  
  local_70 = 0;
  pmVar6 = node->child;
  sVar9 = 0x208;
  if (script_len < 0x208) {
    sVar9 = script_len;
  }
  iVar4 = -2;
  if ((pmVar6 != (miniscript_node_t *)0x0) &&
     (((parent == (miniscript_node_t *)0x0 || (parent->info != (miniscript_item_t *)0x0)) &&
      (local_44 = flag,
      iVar4 = generate_script_from_miniscript
                        (pmVar6,node,derive_child_num,script,script_len,&local_60), iVar4 == 0)))) {
    pmVar7 = pmVar6->next;
    if (pmVar7 == (miniscript_node_t *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      do {
        uVar5 = uVar5 + 1;
        pmVar7 = pmVar7->next;
      } while (pmVar7 != (miniscript_node_t *)0x0);
    }
    local_68 = (ulong)uVar5;
    local_40 = local_68 * 0x50;
    local_38 = parent;
    __base = wally_malloc(local_40);
    if (__base == (void *)0x0) {
      iVar4 = -3;
    }
    else {
      pmVar6 = pmVar6->next;
      if (pmVar6 != (miniscript_node_t *)0x0) {
        uVar5 = 0;
        do {
          *(miniscript_node_t **)((long)__base + (ulong)uVar5 * 0x50) = pmVar6;
          uVar5 = uVar5 + 1;
          pmVar6 = pmVar6->next;
        } while (pmVar6 != (miniscript_node_t *)0x0);
      }
      local_58 = script;
      local_50 = sVar9;
      if (local_68 != 0) {
        sVar9 = 0;
        do {
          local_70 = 0;
          iVar4 = generate_script_from_miniscript
                            (*(miniscript_node_t **)((long)__base + sVar9),node,derive_child_num,
                             (uchar *)((long)__base + sVar9 + 8),0x41,&local_70);
          if (iVar4 != 0) goto LAB_0049d075;
          *(undefined4 *)((long)__base + sVar9 + 0x4c) = (undefined4)local_70;
          sVar9 = sVar9 + 0x50;
        } while (local_40 != sVar9);
      }
      if (local_44 == 8) {
        qsort(__base,local_68,0x50,compare_multisig_node);
      }
      if ((int)local_68 != 0) {
        sVar9 = 0;
        do {
          sVar3 = local_60;
          uVar8 = (ulong)*(uint *)((long)__base + sVar9 + 0x4c);
          if (local_50 < uVar8 + local_60 + 1) goto LAB_0049d075;
          puVar1 = local_58 + local_60;
          piVar2 = (int *)((long)__base + sVar9 + 0x4c);
          memcpy(puVar1 + 1,piVar2 + -0x11,uVar8);
          *puVar1 = (uchar)*piVar2;
          local_60 = sVar3 + (*piVar2 + 1);
          sVar9 = sVar9 + 0x50;
        } while (local_40 != sVar9);
      }
      iVar4 = generate_script_from_number
                        (local_68,local_38,local_58 + local_60,local_50 - local_60,&local_70);
      if (iVar4 == 0) {
        sVar9 = local_60 + local_70;
        uVar8 = local_70 + local_60 + 1;
        local_60 = sVar9;
        if (uVar8 <= local_50) {
          local_58[sVar9] = 0xae;
          *write_len = uVar8;
        }
      }
LAB_0049d075:
      wally_free(__base);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int generate_by_descriptor_multisig(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    int flag,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t child_write_len = 0;
    size_t offset;
    uint32_t count = 0;
    uint32_t index = 0;
    struct miniscript_node_t *child = node->child;
    struct miniscript_node_t *temp_node;
    struct multisig_sort_data_t *sorted_node_array;
    size_t check_len = (DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE > script_len) ? script_len : DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE;

    if (!child || (parent && !parent->info))
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(child, node, derive_child_num, script, script_len, &offset);
    if (ret != WALLY_OK)
        return ret;

    temp_node = child->next;
    while (temp_node != NULL) {
        ++count;
        temp_node = temp_node->next;
    }

    sorted_node_array = (struct multisig_sort_data_t *)wally_malloc(
        count * sizeof(struct multisig_sort_data_t));
    if (!sorted_node_array)
        return WALLY_ENOMEM;

    temp_node = child->next;
    while (temp_node != NULL) {
        sorted_node_array[index].node = temp_node;
        ++index;
        temp_node = temp_node->next;
    }

    if (ret == WALLY_OK) {
        for (index = 0; index < count; ++index) {
            child_write_len = 0;
            ret = generate_script_from_miniscript(
                sorted_node_array[index].node, node, derive_child_num,
                sorted_node_array[index].script,
                sizeof(sorted_node_array[index].script),
                &child_write_len);
            if (ret != WALLY_OK)
                break;
            sorted_node_array[index].script_size = (uint32_t)child_write_len;
        }
    }
    if (ret == WALLY_OK) {
        if (flag == WALLY_SCRIPT_MULTISIG_SORTED) {
            qsort(sorted_node_array, count, sizeof(struct multisig_sort_data_t),
                  compare_multisig_node);
        }
        for (index = 0; index < count; ++index) {
            if (offset + sorted_node_array[index].script_size + 1 > check_len) {
                ret = WALLY_EINVAL;
                break;
            }

            memcpy(&script[offset + 1], sorted_node_array[index].script,
                   sorted_node_array[index].script_size);
            script[offset] = (unsigned char) sorted_node_array[index].script_size;
            offset += sorted_node_array[index].script_size + 1;
        }
    }

    if (ret == WALLY_OK) {
        ret = generate_script_from_number((int64_t)count, parent, &script[offset],
                                          check_len - offset, &child_write_len);
    }

    if (ret == WALLY_OK) {
        offset += child_write_len;
        if (offset + 1 > check_len) {
            ret = WALLY_EINVAL;
        } else {
            script[offset] = OP_CHECKMULTISIG;
            *write_len = offset + 1;
        }
    }
    wally_free(sorted_node_array);
    return WALLY_OK;
}